

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
test_uintwide_t_edge::
generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,test_uintwide_t_edge *this,bool is_positive,
          local_base base_to_get,int digits_in_base_to_get)

{
  result_type rVar1;
  undefined7 in_register_00000011;
  char local_141;
  char local_139;
  char *local_e0;
  char *local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  const_iterator local_c8;
  char local_b9;
  iterator iStack_b8;
  char sign_char_to_insert;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  const_iterator local_a8;
  char *local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  const_iterator local_90;
  char *local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  const_iterator local_78;
  local_base *local_70;
  char *local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string str_x;
  int local_18;
  int digits_in_base_to_get_local;
  local_base base_to_get_local;
  bool is_positive_local;
  
  digits_in_base_to_get_local._3_1_ = (byte)this & 1;
  local_18 = (int)CONCAT71(in_register_00000011,is_positive);
  str_x.field_2._12_4_ = base_to_get;
  _base_to_get_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,(long)(int)base_to_get,'0',&local_41);
  std::allocator<char>::~allocator(&local_41);
  local_60._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  local_68 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
  local_70 = (local_base *)&local_18;
  std::
  generate<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,test_uintwide_t_edge::generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>(bool,test_uintwide_t_edge::local_base,int)::_lambda()_1_>
            (local_60,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_68,(anon_class_8_1_a530db20)local_70);
  if (local_18 == 2) {
    local_80._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_78,&local_80);
    local_88 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,local_78,1,'0');
  }
  else if (local_18 == 1) {
    local_98._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_90,&local_98);
    local_a0 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,local_90,1,'x');
    local_b0._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a8,&local_b0);
    iStack_b8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                       ,local_a8,1,'0');
  }
  if (local_18 == 0) {
    if ((digits_in_base_to_get_local._3_1_ & 1) == 0) {
      rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&dist_sgn,
                         (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
                          *)eng_sgn);
      local_141 = '+';
      if (rVar1 == 0) {
        local_141 = '-';
      }
      local_139 = local_141;
    }
    else {
      local_139 = '+';
    }
    local_b9 = local_139;
    local_d0._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_c8,&local_d0);
    local_d8 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,local_c8,1,local_b9);
  }
  local_e0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>
  ::number<char_const*>
            ((number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>
              *)__return_storage_ptr__,&local_e0,(type *)0x0);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

auto generate_wide_integer_value(bool       is_positive           = true,
                                 local_base base_to_get           = local_base::dec,
                                 int        digits_in_base_to_get = std::numeric_limits<IntegralTypeWithStringConstruction>::digits10) -> IntegralTypeWithStringConstruction
{
  using local_integral_type = IntegralTypeWithStringConstruction;

  static_assert(   (  std::numeric_limits<local_integral_type>::is_signed  && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(63)))
                || ((!std::numeric_limits<local_integral_type>::is_signed) && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(64))),
                "Error: Integral type destination does not have enough digits10");

  std::string str_x(static_cast<std::size_t>(digits_in_base_to_get), '0');

  std::generate(str_x.begin(),
                str_x.end(),
                [&base_to_get]() // NOLINT(modernize-use-trailing-return-type,-warnings-as-errors)
                {
                  char c { };

                  if(base_to_get == local_base::oct)
                  {
                    c = static_cast<char>(dist_dig_oct(eng_dig));
                    c = static_cast<char>(c + '0');
                  }
                  else if(base_to_get == local_base::hex)
                  {
                    c = static_cast<char>(dist_dig_hex(eng_dig));

                    if(c < static_cast<char>(INT8_C(10)))
                    {
                      c = static_cast<char>(c + '0');
                    }
                    else
                    {
                      c =
                        static_cast<char>
                        (
                            static_cast<char>(c + 'A')
                          - static_cast<char>(INT8_C(10))
                        );
                    }
                  }
                  else
                  {
                    c = static_cast<char>(dist_dig_dec(eng_dig));
                    c = static_cast<char>(c + static_cast<char>(INT8_C(0x30)));
                  }

                  return c;
                });

  if(base_to_get == local_base::oct)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }
  else if(base_to_get == local_base::hex)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), 'x');
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }

  if(base_to_get == local_base::dec)
  {
    // Insert either a positive sign or a negative sign
    // (always one or the other) depending on the sign of x.
    const auto sign_char_to_insert =
      static_cast<char>
      (
        is_positive
          ? '+'
          : static_cast<char>((dist_sgn(eng_sgn) != static_cast<std::uint32_t>(UINT32_C(0))) ? '+' : '-') // NOLINT(readability-avoid-nested-conditional-operator)
      );

    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), sign_char_to_insert);
  }

  return local_integral_type(str_x.c_str());
}